

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O1

bool __thiscall
crnd::crn_unpacker::unpack_dxn
          (crn_unpacker *this,uint8 **pDst,uint32 row_pitch_in_bytes,uint32 output_width,
          uint32 output_height)

{
  symbol_codec *this_00;
  uint uVar1;
  block_buffer_element *pbVar2;
  unsigned_short *puVar3;
  unsigned_short *puVar4;
  bool bVar5;
  byte bVar6;
  uint32 uVar8;
  uint uVar9;
  uint32 uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint8 *puVar14;
  uint32 x;
  ulong uVar15;
  uint min_new_capacity;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  byte bVar7;
  
  uVar1 = (this->m_alpha_endpoints).m_size;
  uVar12 = (this->m_block_buffer).m_size;
  min_new_capacity = output_width + 1 & 0xfffffffe;
  if (uVar12 < min_new_capacity) {
    if ((this->m_block_buffer).m_capacity < min_new_capacity) {
      bVar5 = elemental_vector::increase_capacity
                        ((elemental_vector *)&this->m_block_buffer,min_new_capacity,
                         uVar12 + 1 == min_new_capacity,8,(object_mover)0x0);
      if (!bVar5) {
        (this->m_block_buffer).m_alloc_failed = true;
        goto LAB_0011496b;
      }
    }
    (this->m_block_buffer).m_size = min_new_capacity;
  }
LAB_0011496b:
  if ((this->m_pHeader->m_faces).m_buf[0] != '\0') {
    uVar12 = output_height + 1 & 0xfffffffe;
    this_00 = &this->m_codec;
    uVar11 = 0;
    local_b4 = 0;
    local_b0 = 0;
    local_ac = 0;
    do {
      if (uVar12 != 0) {
        puVar14 = pDst[uVar11];
        uVar13 = 0;
        do {
          if (min_new_capacity != 0) {
            bVar5 = uVar13 < output_height;
            uVar15 = 0;
            do {
              if (((uVar13 | (uint)uVar15) & 1) == 0) {
                local_ac = symbol_codec::decode(this_00,&this->m_reference_encoding_dm);
              }
              pbVar2 = (this->m_block_buffer).m_p;
              if ((uVar13 & 1) == 0) {
                bVar7 = (byte)local_ac;
                bVar6 = bVar7 & 3;
                pbVar2[uVar15].endpoint_reference = (ushort)(bVar7 >> 2 & 3);
                local_ac = (uint)(bVar7 >> 4);
              }
              else {
                bVar6 = (byte)pbVar2[uVar15].endpoint_reference;
              }
              if (bVar6 == 1) {
                pbVar2[uVar15].alpha0_endpoint_index = (uint16)local_b4;
                pbVar2[uVar15].alpha1_endpoint_index = (uint16)local_b0;
              }
              else if (bVar6 == 0) {
                uVar8 = symbol_codec::decode(this_00,this->m_endpoint_delta_dm + 1);
                uVar9 = 0;
                if (uVar1 <= uVar8 + local_b4) {
                  uVar9 = uVar1;
                }
                local_b4 = (uVar8 + local_b4) - uVar9;
                pbVar2[uVar15].alpha0_endpoint_index = (uint16)local_b4;
                uVar8 = symbol_codec::decode(this_00,this->m_endpoint_delta_dm + 1);
                uVar9 = 0;
                if (uVar1 <= uVar8 + local_b0) {
                  uVar9 = uVar1;
                }
                local_b0 = (uVar8 + local_b0) - uVar9;
                pbVar2[uVar15].alpha1_endpoint_index = (uint16)local_b0;
              }
              else {
                local_b4 = (uint)pbVar2[uVar15].alpha0_endpoint_index;
                local_b0 = (uint)pbVar2[uVar15].alpha1_endpoint_index;
              }
              bVar5 = (bool)(bVar5 & uVar15 < output_width);
              uVar8 = symbol_codec::decode(this_00,this->m_selector_delta_dm + 1);
              uVar10 = symbol_codec::decode(this_00,this->m_selector_delta_dm + 1);
              if (bVar5) {
                puVar3 = (this->m_alpha_endpoints).m_p;
                puVar4 = (this->m_alpha_selectors).m_p;
                *(uint *)puVar14 = CONCAT22(puVar4[uVar8 * 3],puVar3[local_b4]);
                *(undefined4 *)(puVar14 + 4) = *(undefined4 *)(puVar4 + (ulong)(uVar8 * 3) + 1);
                *(uint *)(puVar14 + 8) = CONCAT22(puVar4[uVar10 * 3],puVar3[local_b0]);
                *(undefined4 *)(puVar14 + 0xc) = *(undefined4 *)(puVar4 + (ulong)(uVar10 * 3) + 1);
              }
              uVar15 = uVar15 + 1;
              puVar14 = puVar14 + 0x10;
            } while (min_new_capacity != uVar15);
          }
          uVar13 = uVar13 + 1;
          puVar14 = puVar14 + (long)(int)((row_pitch_in_bytes >> 2) + min_new_capacity * -4) * 4;
        } while (uVar13 != uVar12);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < (this->m_pHeader->m_faces).m_buf[0]);
  }
  return true;
}

Assistant:

bool unpack_dxn(uint8** pDst, uint32 row_pitch_in_bytes, uint32 output_width, uint32 output_height)
        {
            const uint32 num_alpha_endpoints = m_alpha_endpoints.size();
            const uint32 width = (output_width + 1) & ~1;
            const uint32 height = (output_height + 1) & ~1;
            const int32 delta_pitch_in_dwords = (row_pitch_in_bytes >> 2) - (width << 2);

            if (m_block_buffer.size() < width)
                m_block_buffer.resize(width);

            uint32 alpha0_endpoint_index = 0;
            uint32 alpha1_endpoint_index = 0;
            uint8 reference_group = 0;

            for (uint32 f = 0; f < m_pHeader->m_faces; f++)
            {
                uint32* pData = (uint32*)pDst[f];
                for (uint32 y = 0; y < height; y++, pData += delta_pitch_in_dwords)
                {
                    bool visible = y < output_height;
                    for (uint32 x = 0; x < width; x++, pData += 4)
                    {
                        visible = visible && x < output_width;
                        if (!(y & 1) && !(x & 1))
                            reference_group = m_codec.decode(m_reference_encoding_dm);
                        block_buffer_element& buffer = m_block_buffer[x];
                        uint8 endpoint_reference;
                        if (y & 1)
                        {
                            endpoint_reference = buffer.endpoint_reference;
                        }
                        else
                        {
                            endpoint_reference = reference_group & 3;
                            reference_group >>= 2;
                            buffer.endpoint_reference = reference_group & 3;
                            reference_group >>= 2;
                        }
                        if (!endpoint_reference)
                        {
                            alpha0_endpoint_index += m_codec.decode(m_endpoint_delta_dm[1]);
                            if (alpha0_endpoint_index >= num_alpha_endpoints)
                                alpha0_endpoint_index -= num_alpha_endpoints;
                            buffer.alpha0_endpoint_index = alpha0_endpoint_index;
                            alpha1_endpoint_index += m_codec.decode(m_endpoint_delta_dm[1]);
                            if (alpha1_endpoint_index >= num_alpha_endpoints)
                                alpha1_endpoint_index -= num_alpha_endpoints;
                            buffer.alpha1_endpoint_index = alpha1_endpoint_index;
                        }
                        else if (endpoint_reference == 1)
                        {
                            buffer.alpha0_endpoint_index = alpha0_endpoint_index;
                            buffer.alpha1_endpoint_index = alpha1_endpoint_index;
                        }
                        else
                        {
                            alpha0_endpoint_index = buffer.alpha0_endpoint_index;
                            alpha1_endpoint_index = buffer.alpha1_endpoint_index;
                        }
                        uint32 alpha0_selector_index = m_codec.decode(m_selector_delta_dm[1]);
                        uint32 alpha1_selector_index = m_codec.decode(m_selector_delta_dm[1]);
                        if (visible)
                        {
                            const uint16* pAlpha0_selectors = &m_alpha_selectors[alpha0_selector_index * 3];
                            const uint16* pAlpha1_selectors = &m_alpha_selectors[alpha1_selector_index * 3];
                            pData[0] = m_alpha_endpoints[alpha0_endpoint_index] | (pAlpha0_selectors[0] << 16);
                            pData[1] = pAlpha0_selectors[1] | (pAlpha0_selectors[2] << 16);
                            pData[2] = m_alpha_endpoints[alpha1_endpoint_index] | (pAlpha1_selectors[0] << 16);
                            pData[3] = pAlpha1_selectors[1] | (pAlpha1_selectors[2] << 16);
                        }
                    }
                }
            }
            return true;
        }